

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O3

int bcache_read(filemgr *file,bid_t bid,void *buf)

{
  __pointer_type pfVar1;
  hash_elem *phVar2;
  ulong uVar3;
  size_t __n;
  timeval tp;
  bcache_item query;
  timeval local_80;
  bid_t local_70;
  hash_elem local_60 [2];
  
  pfVar1 = (file->bcache)._M_b._M_p;
  if (pfVar1 != (__pointer_type)0x0) {
    local_70 = bid;
    gettimeofday(&local_80,(__timezone_ptr_t)0x0);
    (pfVar1->access_timestamp).super___atomic_base<unsigned_long>._M_i =
         local_80.tv_sec * 1000000 + local_80.tv_usec;
    uVar3 = bid % pfVar1->num_shards;
    pthread_spin_lock(&pfVar1->shards[uVar3].lock);
    phVar2 = hash_find(&pfVar1->shards[uVar3].hashtable,local_60);
    if (phVar2 == (hash_elem *)0x0) {
      pthread_spin_unlock(&pfVar1->shards[uVar3].lock);
      return 0;
    }
    if (((ulong)phVar2[1].avl.right & 4) == 0) {
      if (((ulong)phVar2[1].avl.right & 1) == 0) {
        list_remove(&pfVar1->shards[uVar3].cleanlist,(list_elem *)(phVar2 + 1));
        list_push_front(&pfVar1->shards[uVar3].cleanlist,(list_elem *)(phVar2 + 1));
      }
      __n = (size_t)bcache_blocksize;
      memcpy(buf,phVar2[-1].avl.right,__n);
      *(bool *)((long)&phVar2[1].avl.right + 1) =
           *(char *)((long)phVar2[-1].avl.right + (__n - 1)) == -1;
      pthread_spin_unlock(&pfVar1->shards[uVar3].lock);
      return bcache_blocksize;
    }
    pthread_spin_unlock(&pfVar1->shards[uVar3].lock);
  }
  return 0;
}

Assistant:

int bcache_read(struct filemgr *file, bid_t bid, void *buf)
{
    struct hash_elem *h;
    struct bcache_item *item;
    struct bcache_item query;
    struct fnamedic_item *fname;

    // Note that we don't need to grab bcache_lock here as the block cache
    // is already created and binded when the file is created or opened for
    // the first time.
    fname = file->bcache.load(std::memory_order_relaxed);

    if (fname) {
        // file exists
        // set query
        query.bid = bid;
        // Update the access timestamp.
        struct timeval tp;
        gettimeofday(&tp, NULL); // TODO: Need to implement a better way of
                                 // getting the timestamp to avoid the overhead of
                                 // gettimeofday()
        atomic_store_uint64_t(&fname->access_timestamp,
                              (uint64_t) (tp.tv_sec * 1000000 + tp.tv_usec),
                              std::memory_order_relaxed);

        size_t shard_num = bid % fname->num_shards;
        spin_lock(&fname->shards[shard_num].lock);

        // search shard hash table
        h = hash_find(&fname->shards[shard_num].hashtable, &query.hash_elem);
        if (h) {
            // cache hit
            item = _get_entry(h, struct bcache_item, hash_elem);
            if (item->flag & BCACHE_FREE) {
                spin_unlock(&fname->shards[shard_num].lock);
                DBG("Warning: failed to read the buffer cache entry for a file '%s' "
                    "because the entry belongs to the free list!\n",
                    file->filename);
                return 0;
            }

            // move the item to the head of list if the block is clean
            // (don't care if the block is dirty)
            if (!(item->flag & BCACHE_DIRTY)) {
                // TODO: Scanning the list would cause some overhead. We need to devise
                // the better data structure to provide a fast lookup for the clean list.
                list_remove(&fname->shards[shard_num].cleanlist, &item->list_elem);
                list_push_front(&fname->shards[shard_num].cleanlist, &item->list_elem);
            }

            memcpy(buf, item->addr, bcache_blocksize);
            _bcache_set_score(item);

            spin_unlock(&fname->shards[shard_num].lock);

            return bcache_blocksize;
        } else {
            // cache miss
            spin_unlock(&fname->shards[shard_num].lock);
        }
    }

    // does not exist .. cache miss
    return 0;
}